

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O0

Cord __thiscall absl::lts_20250127::Cord::Subcord(Cord *this,size_t pos,size_t new_size)

{
  bool bVar1;
  size_t sVar2;
  Nullable<absl::cord_internal::CordRep_*> rep;
  Nullable<const_char_*> pcVar3;
  pointer pbVar4;
  size_type sVar5;
  const_pointer pvVar6;
  CordRep *this_00;
  CordRepBtree *pCVar7;
  ulong in_RCX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar8;
  Cord CVar9;
  ulong local_f8;
  size_t remaining_size;
  ChunkIterator it;
  char *dest;
  CordRep *tree;
  size_t length;
  ulong local_28;
  size_t new_size_local;
  size_t pos_local;
  Cord *this_local;
  Cord *sub_cord;
  
  Cord(this);
  sVar2 = size((Cord *)pos);
  new_size_local = new_size;
  if (sVar2 < new_size) {
    new_size_local = sVar2;
  }
  local_28 = in_RCX;
  if (sVar2 - new_size_local < in_RCX) {
    local_28 = sVar2 - new_size_local;
  }
  uVar8 = extraout_RDX;
  if (local_28 != 0) {
    rep = InlineRep::tree((InlineRep *)pos);
    if (rep == (Nullable<absl::cord_internal::CordRep_*>)0x0) {
      pcVar3 = InlineRep::data((InlineRep *)pos);
      InlineRep::set_data(&this->contents_,pcVar3 + new_size_local,local_28);
      uVar8 = extraout_RDX_00;
    }
    else if (local_28 < 0x10) {
      InlineRep::set_inline_size(&this->contents_,local_28);
      it.btree_reader_.navigator_.node_[0xb] =
           (CordRepBtree *)cord_internal::InlineData::as_chars((InlineData *)this);
      chunk_begin((ChunkIterator *)&remaining_size,(Cord *)pos);
      ChunkIterator::AdvanceBytes((ChunkIterator *)&remaining_size,new_size_local);
      local_f8 = local_28;
      while( true ) {
        pbVar4 = ChunkIterator::operator->((ChunkIterator *)&remaining_size);
        sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size(pbVar4);
        pCVar7 = it.btree_reader_.navigator_.node_[0xb];
        if (local_f8 <= sVar5) break;
        pbVar4 = ChunkIterator::operator->((ChunkIterator *)&remaining_size);
        pvVar6 = std::basic_string_view<char,_std::char_traits<char>_>::data(pbVar4);
        pbVar4 = ChunkIterator::operator->((ChunkIterator *)&remaining_size);
        sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size(pbVar4);
        cord_internal::SmallMemmove<false>((char *)pCVar7,pvVar6,sVar5);
        pbVar4 = ChunkIterator::operator->((ChunkIterator *)&remaining_size);
        sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size(pbVar4);
        local_f8 = local_f8 - sVar5;
        pbVar4 = ChunkIterator::operator->((ChunkIterator *)&remaining_size);
        sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size(pbVar4);
        it.btree_reader_.navigator_.node_[0xb] =
             (CordRepBtree *)
             ((it.btree_reader_.navigator_.node_[0xb]->super_CordRep).storage + (sVar5 - 0xd));
        ChunkIterator::operator++((ChunkIterator *)&remaining_size);
      }
      pbVar4 = ChunkIterator::operator->((ChunkIterator *)&remaining_size);
      pvVar6 = std::basic_string_view<char,_std::char_traits<char>_>::data(pbVar4);
      cord_internal::SmallMemmove<false>((char *)pCVar7,pvVar6,local_f8);
      uVar8 = extraout_RDX_01;
    }
    else {
      this_00 = cord_internal::SkipCrcNode(rep);
      bVar1 = cord_internal::CordRep::IsBtree(this_00);
      if (bVar1) {
        pCVar7 = cord_internal::CordRep::btree(this_00);
        dest = (char *)cord_internal::CordRepBtree::SubTree(pCVar7,new_size_local,local_28);
      }
      else {
        dest = (char *)cord_internal::CordRepSubstring::Substring(this_00,new_size_local,local_28);
      }
      InlineRep::EmplaceTree(&this->contents_,(Nonnull<CordRep_*>)dest,(InlineData *)pos,kSubCord);
      uVar8 = extraout_RDX_02;
    }
  }
  CVar9.contents_.data_.rep_.field_0.as_tree.rep = (CordRep *)uVar8;
  CVar9.contents_.data_.rep_.field_0.as_tree.cordz_info = (cordz_info_t)this;
  return (Cord)CVar9.contents_.data_.rep_.field_0;
}

Assistant:

Cord Cord::Subcord(size_t pos, size_t new_size) const {
  Cord sub_cord;
  size_t length = size();
  if (pos > length) pos = length;
  if (new_size > length - pos) new_size = length - pos;
  if (new_size == 0) return sub_cord;

  CordRep* tree = contents_.tree();
  if (tree == nullptr) {
    sub_cord.contents_.set_data(contents_.data() + pos, new_size);
    return sub_cord;
  }

  if (new_size <= InlineRep::kMaxInline) {
    sub_cord.contents_.set_inline_size(new_size);
    char* dest = sub_cord.contents_.data_.as_chars();
    Cord::ChunkIterator it = chunk_begin();
    it.AdvanceBytes(pos);
    size_t remaining_size = new_size;
    while (remaining_size > it->size()) {
      cord_internal::SmallMemmove(dest, it->data(), it->size());
      remaining_size -= it->size();
      dest += it->size();
      ++it;
    }
    cord_internal::SmallMemmove(dest, it->data(), remaining_size);
    return sub_cord;
  }

  tree = cord_internal::SkipCrcNode(tree);
  if (tree->IsBtree()) {
    tree = tree->btree()->SubTree(pos, new_size);
  } else {
    tree = CordRepSubstring::Substring(tree, pos, new_size);
  }
  sub_cord.contents_.EmplaceTree(tree, contents_.data_,
                                 CordzUpdateTracker::kSubCord);
  return sub_cord;
}